

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O0

void __thiscall CriticalSectionsBuilder::~CriticalSectionsBuilder(CriticalSectionsBuilder *this)

{
  bool bVar1;
  reference ppVar2;
  long in_RDI;
  pair<const_llvm::CallInst_*const,_CriticalSection_*> iterator;
  iterator __end1;
  iterator __begin1;
  map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
  *__range1;
  map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
  *in_stack_ffffffffffffffb8;
  CriticalSection *this_00;
  _Self local_20;
  _Self local_18;
  long local_10;
  
  local_10 = in_RDI + 200;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
       ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>::
             operator*((_Rb_tree_iterator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>
                        *)0x1aed9b);
    this_00 = ppVar2->second;
    if (this_00 != (CriticalSection *)0x0) {
      CriticalSection::~CriticalSection((CriticalSection *)0x1aedc6);
      operator_delete(this_00,0x38);
    }
    std::_Rb_tree_iterator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_> *)
               this_00);
  }
  std::
  map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
  ::~map((map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
          *)0x1aedf4);
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::~set
            ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)0x1aee05);
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::~set
            ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)0x1aee13);
  std::set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>::~set
            ((set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_> *)0x1aee21);
  std::set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_>::~set
            ((set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_> *)0x1aee2b);
  return;
}

Assistant:

CriticalSectionsBuilder::~CriticalSectionsBuilder() {
    for (auto iterator : criticalSections_) {
        delete iterator.second;
    }
}